

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

QString * QFileDialog::getExistingDirectory
                    (QString *__return_storage_ptr__,QWidget *parent,QString *caption,QString *dir,
                    Options options)

{
  char cVar1;
  long in_FS_OFFSET;
  QUrl selectedUrl;
  QArrayDataPointer<char16_t> local_88;
  undefined1 local_70 [16];
  qsizetype local_60;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_70._0_8_ = (QUrlPrivate *)0x0;
  local_88.d = (Data *)0x0;
  local_88.ptr = (char16_t *)0x0;
  local_70._8_8_ = L"file";
  local_88.size = 0;
  local_60 = 4;
  QList<QString>::QList<QString,void>((QList<QString> *)&local_58,(QString *)local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  local_70._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QUrl::fromLocalFile((QString *)&local_88);
  getExistingDirectoryUrl
            ((QFileDialog *)local_70,parent,caption,(QUrl *)&local_88,options,
             (QStringList *)&local_58);
  QUrl::~QUrl((QUrl *)&local_88);
  cVar1 = QUrl::isLocalFile();
  if (cVar1 == '\0') {
    cVar1 = QUrl::isEmpty();
    if (cVar1 == '\0') {
      QUrl::toString(__return_storage_ptr__,local_70,0);
      goto LAB_0049e070;
    }
  }
  QUrl::toLocalFile();
LAB_0049e070:
  QUrl::~QUrl((QUrl *)local_70);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QFileDialog::getExistingDirectory(QWidget *parent,
                                          const QString &caption,
                                          const QString &dir,
                                          Options options)
{
    const QStringList schemes = QStringList(QStringLiteral("file"));
    const QUrl selectedUrl =
            getExistingDirectoryUrl(parent, caption, QUrl::fromLocalFile(dir), options, schemes);
    if (selectedUrl.isLocalFile() || selectedUrl.isEmpty())
        return selectedUrl.toLocalFile();
    else
        return selectedUrl.toString();
}